

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesDiagnosticsRunTests
          (zes_diag_handle_t hDiagnostics,uint32_t startIndex,uint32_t endIndex,
          zes_diag_result_t *pResult)

{
  zes_pfnDiagnosticsRunTests_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnDiagnosticsRunTests_t pfnRunTests;
  zes_diag_result_t *pResult_local;
  uint32_t endIndex_local;
  uint32_t startIndex_local;
  zes_diag_handle_t hDiagnostics_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Diagnostics).pfnRunTests;
    if (p_Var1 == (zes_pfnDiagnosticsRunTests_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hDiagnostics_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hDiagnostics_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hDiagnostics_local._4_4_ = (*p_Var1)(hDiagnostics,startIndex,endIndex,pResult);
    }
  }
  else {
    hDiagnostics_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hDiagnostics_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesDiagnosticsRunTests(
    zes_diag_handle_t hDiagnostics,                 ///< [in] Handle for the component.
    uint32_t startIndex,                            ///< [in] The index of the first test to run. Set to
                                                    ///< ::ZES_DIAG_FIRST_TEST_INDEX to start from the beginning.
    uint32_t endIndex,                              ///< [in] The index of the last test to run. Set to
                                                    ///< ::ZES_DIAG_LAST_TEST_INDEX to complete all tests after the start test.
    zes_diag_result_t* pResult                      ///< [in,out] The result of the diagnostics
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnDiagnosticsRunTests_t pfnRunTests = [&result] {
        auto pfnRunTests = ze_lib::context->zesDdiTable.load()->Diagnostics.pfnRunTests;
        if( nullptr == pfnRunTests ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnRunTests;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnRunTests( hDiagnostics, startIndex, endIndex, pResult );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnRunTests = ze_lib::context->zesDdiTable.load()->Diagnostics.pfnRunTests;
    if( nullptr == pfnRunTests ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnRunTests( hDiagnostics, startIndex, endIndex, pResult );
    #endif
}